

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixCheckReservedLock(unqlite_file *id,int *pResOut)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int unqliteIOErr;
  flock lock;
  
  if (*(int *)((long)&(id[1].pMethods)->xRead + 4) < 2) {
    iVar2 = 0;
    unqliteIOErr = 5;
    iVar1 = fcntl(*(int *)&id[2].pMethods,5);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      iVar2 = unqliteErrorFromPosixError(iVar1,unqliteIOErr);
      *(int *)((long)&id[3].pMethods + 4) = iVar1;
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar2 = 0;
    iVar1 = 1;
  }
  *pResOut = iVar1;
  return iVar2;
}

Assistant:

static int unixCheckReservedLock(unqlite_file *id, int *pResOut){
  int rc = UNQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

 
  unixEnterMutex(); /* Because pFile->pInode is shared across threads */

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
  if( !reserved ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if (-1 == fcntl(pFile->h, F_GETLK, &lock)) {
      int tErrno = errno;
	  rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      pFile->lastErrno = tErrno;
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
  
  unixLeaveMutex();
 
  *pResOut = reserved;
  return rc;
}